

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceKinematicsScene.cpp
# Opt level: O2

void __thiscall
COLLADAFW::InstanceKinematicsScene::InstanceKinematicsScene
          (InstanceKinematicsScene *this,InstanceKinematicsScene *pre)

{
  InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>::InstanceBase
            (&this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>,
             &pre->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>);
  (this->super_InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)1008>).
  super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)1008>.super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceKinematicsScene_00a04620;
  (this->mBoundNodes)._vptr_Array = (_func_int **)&PTR_releaseMemory_00953e48;
  (this->mBoundNodes).mData = (UniqueId *)0x0;
  (this->mBoundNodes).mCount = 0;
  (this->mBoundNodes).mCapacity = 0;
  (this->mBoundNodes).mFlags = 3;
  (this->mNodeLinkBindings)._vptr_Array = (_func_int **)&PTR_releaseMemory_00a04708;
  (this->mNodeLinkBindings).mData = (NodeLinkBinding *)0x0;
  (this->mNodeLinkBindings).mCount = 0;
  (this->mNodeLinkBindings).mCapacity = 0;
  (this->mNodeLinkBindings).mFlags = 3;
  this->mFileId = pre->mFileId;
  Array<COLLADAFW::UniqueId>::cloneArray(&pre->mBoundNodes,&this->mBoundNodes);
  Array<COLLADAFW::InstanceKinematicsScene::NodeLinkBinding>::cloneArray
            (&pre->mNodeLinkBindings,&this->mNodeLinkBindings);
  return;
}

Assistant:

InstanceKinematicsScene::InstanceKinematicsScene( const InstanceKinematicsScene& pre )
		: InstanceBase<COLLADA_TYPE::INSTANCE_KINEMATICS_SCENE>(pre)
		, mBoundNodes(UniqueIdArray::OWNER)
		, mNodeLinkBindings(NodeLinkBindingArray::OWNER)
		, mFileId(pre.mFileId)
	{
		pre.mBoundNodes.cloneArray(mBoundNodes);
		pre.mNodeLinkBindings.cloneArray(mNodeLinkBindings);
	}